

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

void __thiscall
duckdb::StructColumnData::Append
          (StructColumnData *this,BaseStatistics *stats,ColumnAppendState *state,Vector *vector,
          idx_t count)

{
  atomic<unsigned_long> *paVar1;
  reference pvVar2;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  reference this_01;
  pointer pCVar3;
  BaseStatistics *pBVar4;
  reference this_02;
  type pVVar5;
  ulong __n;
  Vector append_vector;
  Vector local_98;
  
  if (vector->vector_type == FLAT_VECTOR) {
    pvVar2 = vector<duckdb::ColumnAppendState,_true>::get<true>(&state->child_appends,0);
    ColumnData::Append(&(this->validity).super_ColumnData,stats,pvVar2,vector,count);
    this_00 = StructVector::GetEntries(vector);
    __n = 0;
    while (__n < (ulong)((long)(this_00->
                               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this_00->
                               super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ).
                               super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3)) {
      this_01 = vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_true>
                ::get<true>(&this->sub_columns,__n);
      pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
               operator->(this_01);
      pBVar4 = StructStats::GetChildStats(stats,__n);
      pvVar2 = vector<duckdb::ColumnAppendState,_true>::get<true>(&state->child_appends,__n + 1);
      this_02 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::get<true>(this_00,__n);
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                         (this_02);
      (*pCVar3->_vptr_ColumnData[0x12])(pCVar3,pBVar4,pvVar2,pVVar5,count);
      __n = __n + 1;
    }
    LOCK();
    paVar1 = &(this->super_ColumnData).count;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + count;
    UNLOCK();
  }
  else {
    Vector::Vector(&local_98,vector);
    Vector::Flatten(&local_98,count);
    (*(this->super_ColumnData)._vptr_ColumnData[0x12])(this,stats,state,&local_98,count);
    Vector::~Vector(&local_98);
  }
  return;
}

Assistant:

void StructColumnData::Append(BaseStatistics &stats, ColumnAppendState &state, Vector &vector, idx_t count) {
	if (vector.GetVectorType() != VectorType::FLAT_VECTOR) {
		Vector append_vector(vector);
		append_vector.Flatten(count);
		Append(stats, state, append_vector, count);
		return;
	}

	// append the null values
	validity.Append(stats, state.child_appends[0], vector, count);

	auto &child_entries = StructVector::GetEntries(vector);
	for (idx_t i = 0; i < child_entries.size(); i++) {
		sub_columns[i]->Append(StructStats::GetChildStats(stats, i), state.child_appends[i + 1], *child_entries[i],
		                       count);
	}
	this->count += count;
}